

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::MaybeScheduleCompaction(DBImpl *this)

{
  bool bVar1;
  atomic<bool> *in_RDI;
  atomic<bool> *this_00;
  
  this_00 = in_RDI;
  port::Mutex::AssertHeld((Mutex *)(in_RDI + 0x8c8));
  if (((((in_RDI[0xa10]._M_base._M_i & 1U) == 0) &&
       (bVar1 = std::atomic<bool>::load(this_00,(memory_order)((ulong)in_RDI >> 0x20)), !bVar1)) &&
      (bVar1 = Status::ok((Status *)(in_RDI + 0xa28)), bVar1)) &&
     (((*(long *)(in_RDI + 0x938) != 0 || (*(long *)(in_RDI + 0xa18) != 0)) ||
      (bVar1 = VersionSet::NeedsCompaction(*(VersionSet **)(in_RDI + 0xa20)), bVar1)))) {
    in_RDI[0xa10]._M_base._M_i = true;
    (**(code **)(**(long **)(in_RDI + 8) + 0x78))(*(long **)(in_RDI + 8),BGWork);
  }
  return;
}

Assistant:

void DBImpl::MaybeScheduleCompaction() {
  mutex_.AssertHeld();
  if (background_compaction_scheduled_) {
    // Already scheduled
  } else if (shutting_down_.load(std::memory_order_acquire)) {
    // DB is being deleted; no more background compactions
  } else if (!bg_error_.ok()) {
    // Already got an error; no more changes
  } else if (imm_ == nullptr && manual_compaction_ == nullptr &&
             !versions_->NeedsCompaction()) {
    // No work to be done
  } else {
    background_compaction_scheduled_ = true;
    env_->Schedule(&DBImpl::BGWork, this);
  }
}